

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hadamard.cpp
# Opt level: O0

void test_qclab_qgates_Hadamard<float>(void)

{
  allocator<float> *paVar1;
  undefined1 *this;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  bool bVar2;
  char *pcVar3;
  reference lhs;
  float *pfVar4;
  char *in_R9;
  __type_conflict _Var5;
  double dVar6;
  float local_7b0;
  float local_7ac;
  float local_7a8;
  float local_7a4;
  iterator local_7a0;
  undefined8 local_798;
  allocator<float> local_789;
  float local_788;
  float local_784;
  float local_780;
  float local_77c;
  iterator local_778;
  size_type local_770;
  undefined1 local_768 [8];
  V check2;
  V vec2;
  float local_730;
  float local_72c;
  iterator local_728;
  size_type local_720;
  undefined1 local_718 [8];
  V check1;
  V vec1;
  Hadamard<float> H1;
  Hadamard<float> H0;
  float local_6c0 [4];
  iterator local_6b0;
  size_type local_6a8;
  undefined1 local_6a0 [8];
  V v2;
  float local_680 [2];
  iterator local_678;
  size_type local_670;
  undefined1 local_668 [8];
  V v1;
  undefined1 local_648 [4];
  R c;
  AssertHelper local_628;
  Message local_620;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_5e0;
  Message local_5d8;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__2;
  Hadamard<float> H2;
  AssertHelper local_588;
  Message local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_15;
  Message local_540;
  int local_538;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_14;
  stringstream qasm;
  ostream local_510 [376];
  AssertHelper local_398;
  Message local_390;
  double local_388;
  SquareMatrix<float> local_380;
  __type_conflict local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_13;
  Message local_350;
  double local_348;
  SquareMatrix<float> local_340;
  __type_conflict local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_12;
  Message local_310;
  double local_308;
  SquareMatrix<float> local_300;
  __type_conflict local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0;
  double local_2c8;
  SquareMatrix<float> local_2c0;
  __type_conflict local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_10;
  Message local_290;
  SquareMatrix<float> local_288;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_9;
  Message local_260;
  SquareMatrix<float> local_258;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_8;
  Message local_230;
  SquareMatrix<float> local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_7;
  Message local_200;
  SquareMatrix<float> local_1f8;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_6;
  Message local_1d0;
  int local_1c8;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  int qnew;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  int local_16c;
  size_type local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> qubits;
  Message local_130;
  int local_128;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_100;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  Message local_50;
  int local_48 [5];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Hadamard<float> H;
  R tol;
  
  std::numeric_limits<float>::epsilon();
  qclab::qgates::Hadamard<float>::Hadamard((Hadamard<float> *)&gtest_ar.message_);
  local_34 = qclab::qgates::QGate1<float>::nbQubits((QGate1<float> *)&gtest_ar.message_);
  local_48[0] = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"H.nbQubits()","1",&local_34,local_48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_69 = qclab::qgates::Hadamard<float>::fixed((Hadamard<float> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,(AssertionResult *)"H.fixed()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bVar2 = qclab::qgates::QGate1<float>::controlled((QGate1<float> *)&gtest_ar.message_);
  local_b1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b0,
               (AssertionResult *)"H.controlled()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_fc = qclab::qgates::QGate1<float>::qubit((QGate1<float> *)&gtest_ar.message_);
  local_100 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f8,"H.qubit()","0",&local_fc,&local_100);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  qclab::qgates::QGate1<float>::setQubit((QGate1<float> *)&gtest_ar.message_,2);
  local_124 = qclab::qgates::QGate1<float>::qubit((QGate1<float> *)&gtest_ar.message_);
  local_128 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_120,"H.qubit()","2",&local_124,&local_128);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_130);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  qclab::qgates::QGate1<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,
             (QGate1<float> *)&gtest_ar.message_);
  local_168 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  local_16c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_160,"qubits.size()","1",&local_168,&local_16c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  lhs = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,0);
  local_194 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_190,"qubits[0]","2",lhs,&local_194);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe58,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe58);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  qclab::qgates::QGate1<float>::setQubits
            ((QGate1<float> *)&gtest_ar.message_,
             (int *)((long)&gtest_ar_5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_1c4 = qclab::qgates::QGate1<float>::qubit((QGate1<float> *)&gtest_ar.message_);
  local_1c8 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c0,"H.qubit()","3",&local_1c4,&local_1c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_1f8);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_1f8,0,0);
  _Var5 = std::real<float>(*pfVar4);
  dVar6 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e8,"std::real( H.matrix()(0,0) )","1.0 / std::sqrt( 2.0 )","tol",
             (double)_Var5,1.0 / dVar6,1.1920928955078125e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_228);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_228,1,0);
  _Var5 = std::real<float>(*pfVar4);
  dVar6 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_218,"std::real( H.matrix()(1,0) )","1.0 / std::sqrt( 2.0 )","tol",
             (double)_Var5,1.0 / dVar6,1.1920928955078125e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_228);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_258);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_258,0,1);
  _Var5 = std::real<float>(*pfVar4);
  dVar6 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_248,"std::real( H.matrix()(0,1) )","1.0 / std::sqrt( 2.0 )","tol",
             (double)_Var5,1.0 / dVar6,1.1920928955078125e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_258);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar2) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_288);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_288,1,1);
  _Var5 = std::real<float>(*pfVar4);
  dVar6 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_278,"std::real( H.matrix()(1,1) )","-1.0 / std::sqrt( 2.0 )","tol",
             (double)_Var5,-1.0 / dVar6,1.1920928955078125e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_288);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_2c0);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_2c0,0,0);
  local_2ac = std::imag<float>(*pfVar4);
  local_2c8 = 0.0;
  testing::internal::EqHelper::Compare<float,_double,_nullptr>
            ((EqHelper *)local_2a8,"std::imag( H.matrix()(0,0) )","0.0",&local_2ac,&local_2c8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_2c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_300);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_300,1,0);
  local_2ec = std::imag<float>(*pfVar4);
  local_308 = 0.0;
  testing::internal::EqHelper::Compare<float,_double,_nullptr>
            ((EqHelper *)local_2e8,"std::imag( H.matrix()(1,0) )","0.0",&local_2ec,&local_308);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_300);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(&local_310);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_340);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_340,0,1);
  local_32c = std::imag<float>(*pfVar4);
  local_348 = 0.0;
  testing::internal::EqHelper::Compare<float,_double,_nullptr>
            ((EqHelper *)local_328,"std::imag( H.matrix()(0,1) )","0.0",&local_32c,&local_348);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  qclab::qgates::Hadamard<float>::matrix((Hadamard<float> *)&local_380);
  pfVar4 = qclab::dense::SquareMatrix<float>::operator()(&local_380,1,1);
  local_36c = std::imag<float>(*pfVar4);
  local_388 = 0.0;
  testing::internal::EqHelper::Compare<float,_double,_nullptr>
            ((EqHelper *)local_368,"std::imag( H.matrix()(1,1) )","0.0",&local_36c,&local_388);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_380);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar2) {
    testing::Message::Message(&local_390);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  qclab::qgates::QGate1<float>::print((QGate1<float> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_14.message_);
  local_534 = qclab::qgates::Hadamard<float>::toQASM
                        ((Hadamard<float> *)&gtest_ar.message_,local_510,0);
  local_538 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_530,"H.toQASM( qasm )","0",&local_534,&local_538);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_558,"qasm.str()","\"h q[3];\\n\"",&local_578,
             (char (*) [9])"h q[3];\n");
  std::__cxx11::string::~string((string *)&local_578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar2) {
    testing::Message::Message(&local_580);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&H2.super_QGate1<float>.qubit_);
  std::__cxx11::string::~string((string *)&H2.super_QGate1<float>.qubit_);
  qclab::qgates::Hadamard<float>::Hadamard((Hadamard<float> *)&gtest_ar__2.message_);
  local_5c9 = qclab::QObject<float>::operator==
                        ((QObject<float> *)&gtest_ar.message_,
                         (QObject<float> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar2) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_5c8,(AssertionResult *)"H == H2",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  bVar2 = qclab::QObject<float>::operator!=
                    ((QObject<float> *)&gtest_ar.message_,(QObject<float> *)&gtest_ar__2.message_);
  local_611 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar2) {
    testing::Message::Message(&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_648,(internal *)local_610,(AssertionResult *)"H != H2","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Hadamard.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=(&local_628,&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    std::__cxx11::string::~string((string *)local_648);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  dVar6 = std::sqrt(5.30498947741318e-315);
  v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1.0 / SUB84(dVar6,0);
  local_680[0] = 3.0;
  local_680[1] = 5.0;
  local_678 = local_680;
  local_670 = 2;
  paVar1 = (allocator<float> *)
           ((long)&v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_03._M_len = local_670;
  __l_03._M_array = local_678;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_668,__l_03,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_6c0[0] = 3.0;
  local_6c0[1] = 5.0;
  local_6c0[2] = 2.0;
  local_6c0[3] = 7.0;
  local_6b0 = local_6c0;
  local_6a8 = 4;
  this = &H0.super_QGate1<float>.field_0xf;
  std::allocator<float>::allocator((allocator<float> *)this);
  __l_02._M_len = local_6a8;
  __l_02._M_array = local_6b0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_6a0,__l_02,(allocator_type *)this);
  std::allocator<float>::~allocator((allocator<float> *)&H0.super_QGate1<float>.field_0xf);
  qclab::qgates::Hadamard<float>::Hadamard((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,0);
  qclab::qgates::Hadamard<float>::Hadamard
            ((Hadamard<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_668);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,NoTrans,1,
             (vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_730 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0;
  local_72c = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 -
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0;
  local_728 = &local_730;
  local_720 = 2;
  paVar1 = (allocator<float> *)
           ((long)&vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_01._M_len = local_720;
  __l_01._M_array = local_728;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_718,__l_01,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_718);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_668);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,Trans,1,
             (vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_718);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_668);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,ConjTrans,1,
             (vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_718);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,NoTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_788 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
  local_784 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0 +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 7.0;
  local_780 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 -
              (v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_);
  local_77c = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0 -
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 7.0;
  local_778 = &local_788;
  local_770 = 4;
  std::allocator<float>::allocator(&local_789);
  __l_00._M_len = local_770;
  __l_00._M_array = local_778;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_768,__l_00,&local_789);
  std::allocator<float>::~allocator(&local_789);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,Trans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)&H1.super_QGate1<float>.qubit_,ConjTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_7b0 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0;
  local_7ac = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 3.0 -
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 5.0;
  local_7a8 = v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 7.0;
  local_7a4 = (v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ +
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_) -
              v1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * 7.0;
  local_7a0 = &local_7b0;
  local_798 = 4;
  __l._M_len = 4;
  __l._M_array = local_7a0;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_768,__l);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,Trans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_6a0);
  qclab::qgates::Hadamard<float>::apply
            ((Hadamard<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,ConjTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<float>
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_768);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_718);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::Hadamard<float>::~Hadamard
            ((Hadamard<float> *)
             &vec1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  qclab::qgates::Hadamard<float>::~Hadamard((Hadamard<float> *)&H1.super_QGate1<float>.qubit_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_6a0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_668);
  qclab::qgates::Hadamard<float>::~Hadamard((Hadamard<float> *)&gtest_ar__2.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_14.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  qclab::qgates::Hadamard<float>::~Hadamard((Hadamard<float> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_qgates_Hadamard() {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  qclab::qgates::Hadamard< T >  H ;

  EXPECT_EQ( H.nbQubits() , 1 ) ;   // nbQubits
  EXPECT_TRUE( H.fixed() ) ;        // fixed
  EXPECT_FALSE( H.controlled() ) ;  // controlled

  // qubit
  EXPECT_EQ( H.qubit() , 0 ) ;
  H.setQubit( 2 ) ;
  EXPECT_EQ( H.qubit() , 2 ) ;

  // qubits
  auto qubits = H.qubits() ;
  EXPECT_EQ( qubits.size() , 1 ) ;
  EXPECT_EQ( qubits[0] , 2 ) ;
  int qnew = 3 ;
  H.setQubits( &qnew ) ;
  EXPECT_EQ( H.qubit() , 3 ) ;

  // matrix
  EXPECT_NEAR( std::real( H.matrix()(0,0) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(1,0) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(0,1) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(1,1) ) , -1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_EQ( std::imag( H.matrix()(0,0) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(1,0) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(0,1) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(1,1) ) , 0.0 ) ;

  // print
  H.print() ;

  // toQASM
  std::stringstream qasm ;
  EXPECT_EQ( H.toQASM( qasm ) , 0 ) ;
  EXPECT_EQ( qasm.str() , "h q[3];\n" ) ;
  std::cout << qasm.str() ;

  // operators == and !=
  qclab::qgates::Hadamard< T > H2 ;
  EXPECT_TRUE( H == H2 ) ;
  EXPECT_FALSE( H != H2 ) ;

  // apply
  {
    const R c = R(1) / std::sqrt( R(2) ) ;
    using V = std::vector< T > ;
    const V v1 = { 3 , 5 } ;
    const V v2 = { 3 , 5 , 2 , 7 } ;

    qclab::qgates::Hadamard< T >  H0( 0 ) ;
    qclab::qgates::Hadamard< T >  H1( 1 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    H0.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { c*T(3) + c*T(5) , c*T(3) - c*T(5) } ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    vec1 = v1 ;
    H0.apply( qclab::Op::Trans , 1 , vec1 ) ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    vec1 = v1 ;
    H0.apply( qclab::Op::ConjTrans , 1 , vec1 ) ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::ConjTrans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    H0.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { c*T(3) + c*T(2) , c*T(5) + c*T(7) ,
                 c*T(3) - c*T(2) , c*T(5) - c*T(7) } ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H0.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H0.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { c*T(3) + c*T(5) , c*T(3) - c*T(5) ,
               c*T(2) + c*T(7) , c*T(2) - c*T(7) } ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif
  }

}